

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O0

AMQP_VALUE messaging_create_target(char *address)

{
  int iVar1;
  TARGET_HANDLE target_00;
  LOGGER_LOG p_Var2;
  AMQP_VALUE address_value_00;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_VALUE address_value;
  LOGGER_LOG l;
  TARGET_HANDLE target;
  AMQP_VALUE result;
  char *address_local;
  
  target_00 = target_create();
  if (target_00 == (TARGET_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                ,"messaging_create_target",0x41,1,"NULL target");
    }
    target = (TARGET_HANDLE)0x0;
  }
  else {
    address_value_00 = amqpvalue_create_string(address);
    if (address_value_00 == (AMQP_VALUE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                  ,"messaging_create_target",0x49,1,"Cannot create address AMQP string");
      }
      target = (TARGET_HANDLE)0x0;
    }
    else {
      iVar1 = target_set_address(target_00,address_value_00);
      if (iVar1 == 0) {
        target = (TARGET_HANDLE)amqpvalue_create_target(target_00);
        if (((AMQP_VALUE)target == (AMQP_VALUE)0x0) &&
           (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                    ,"messaging_create_target",0x58,1,"Cannot create target");
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/messaging.c"
                    ,"messaging_create_target",0x50,1,"Cannot set address on target");
        }
        target = (TARGET_HANDLE)0x0;
      }
      amqpvalue_destroy(address_value_00);
    }
    target_destroy(target_00);
  }
  return (AMQP_VALUE)target;
}

Assistant:

AMQP_VALUE messaging_create_target(const char* address)
{
    AMQP_VALUE result;
    TARGET_HANDLE target = target_create();

    if (target == NULL)
    {
        LogError("NULL target");
        result = NULL;
    }
    else
    {
        AMQP_VALUE address_value = amqpvalue_create_string(address);
        if (address_value == NULL)
        {
            LogError("Cannot create address AMQP string");
            result = NULL;
        }
        else
        {
            if (target_set_address(target, address_value) != 0)
            {
                LogError("Cannot set address on target");
                result = NULL;
            }
            else
            {
                result = amqpvalue_create_target(target);
                if (result == NULL)
                {
                    LogError("Cannot create target");
                }
                else
                {
                    /* all ok */
                }
            }

            amqpvalue_destroy(address_value);
        }

        target_destroy(target);
    }

    return result;
}